

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

void Search::advance_from_known_actions(search_private *priv)

{
  search_private *psVar1;
  search_private *psVar2;
  v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_> *pvVar3;
  v_array<COST_SENSITIVE::wclass> *pvVar4;
  pair<COST_SENSITIVE::wclass_&,_bool> *ppVar5;
  wclass *new_ele;
  long in_RDI;
  size_t t;
  v_array<COST_SENSITIVE::wclass> *this;
  search_private *priv_00;
  
  psVar1 = *(search_private **)(in_RDI + 0x230);
  if ((((*(byte *)(in_RDI + 0x611) & 1) != 0) && (*(float *)(in_RDI + 0x614) <= 0.0)) &&
     (priv_00 = psVar1,
     psVar2 = (search_private *)
              v_array<v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_>_>::size
                        ((v_array<v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_>_> *)
                         (in_RDI + 0x5f0)), psVar1 < psVar2)) {
    this = *(v_array<COST_SENSITIVE::wclass> **)(in_RDI + 0x238);
    pvVar3 = v_array<v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_>_>::operator[]
                       ((v_array<v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_>_> *)
                        (in_RDI + 0x5f0),(size_t)priv_00);
    pvVar4 = (v_array<COST_SENSITIVE::wclass> *)
             v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_>::size(pvVar3);
    if (this < pvVar4) {
      pvVar3 = v_array<v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_>_>::operator[]
                         ((v_array<v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_>_> *)
                          (in_RDI + 0x5f0),(size_t)priv_00);
      ppVar5 = v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_>::operator[]
                         (pvVar3,*(size_t *)(in_RDI + 0x238));
      if ((ppVar5->second & 1U) == 0) {
        new_ele = (wclass *)(in_RDI + 0x580);
        pvVar3 = v_array<v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_>_>::operator[]
                           ((v_array<v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_>_> *)
                            (in_RDI + 0x5f0),(size_t)priv_00);
        v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_>::operator[]
                  (pvVar3,*(size_t *)(in_RDI + 0x238));
        v_array<COST_SENSITIVE::wclass>::push_back(this,new_ele);
        *(long *)(in_RDI + 0x238) = *(long *)(in_RDI + 0x238) + 1;
        advance_from_known_actions(priv_00);
      }
    }
    else {
      *(undefined1 *)(in_RDI + 0x240) = 1;
    }
  }
  return;
}

Assistant:

void advance_from_known_actions(search_private& priv)
{
  size_t t = priv.learn_t;
  if (!priv.active_csoaa)
    return;
  if (priv.active_csoaa_verify > 0.)
    return;
  if (t >= priv.active_known.size())
    return;
  cdbg << "advance_from_known_actions t=" << t << " active_known.size()=" << priv.active_known.size()
       << " learn_a_idx=" << priv.learn_a_idx << endl;
  // cdbg_print_array(" active_known[t]", priv.active_known[t]);
  if (priv.learn_a_idx >= priv.active_known[t].size())
  {
    cdbg << "advance_from_known_actions setting done_with_all_actions=true (active_known[t].size()="
         << priv.active_known[t].size() << ")" << endl;
    priv.done_with_all_actions = true;
    return;
  }
  // if (priv.active_known[t][priv.learn_a_idx] >= FLT_MAX) return;
  if (priv.active_known[t][priv.learn_a_idx].second)
    return;
  // return;
  // wow, we actually found something we were confident about!
  /*
  cs_cost_push_back(priv.cb_learner,
                    priv.learn_losses,
                    priv.is_ldf ? (uint32_t)(priv.learn_a_idx - 1) : (uint32_t)priv.learn_a_idx,
                    priv.active_known[t][priv.learn_a_idx],
                    true);
  */
  priv.learn_losses.cs.costs.push_back(priv.active_known[t][priv.learn_a_idx].first);
  cdbg << "  --> adding " << priv.learn_a_idx << ":" << priv.active_known[t][priv.learn_a_idx].first.x << endl;
  priv.learn_a_idx++;
  advance_from_known_actions(priv);
}